

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternMaxDepth(xmlPatternPtr comp)

{
  byte *pbVar1;
  xmlStreamCompPtr pxVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = 0xffffffff;
  if (comp != (xmlPatternPtr)0x0) {
    uVar4 = 0;
    for (; (uVar3 = uVar4, comp != (xmlPatternPtr)0x0 &&
           (pxVar2 = comp->stream, uVar3 = 0xffffffff, pxVar2 != (xmlStreamCompPtr)0x0));
        comp = comp->next) {
      uVar3 = pxVar2->nbStep;
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      lVar6 = 0;
      while (uVar5 * 0x20 + 0x20 != lVar6 + 0x20) {
        pbVar1 = (byte *)((long)&pxVar2->steps->flags + lVar6);
        lVar6 = lVar6 + 0x20;
        if ((*pbVar1 & 1) != 0) {
          return -2;
        }
      }
      if ((int)uVar4 < (int)uVar3) {
        uVar4 = uVar3;
      }
    }
  }
  return uVar3;
}

Assistant:

int
xmlPatternMaxDepth(xmlPatternPtr comp) {
    int ret = 0, i;
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	for (i = 0;i < comp->stream->nbStep;i++)
	    if (comp->stream->steps[i].flags & XML_STREAM_STEP_DESC)
	        return(-2);
	if (comp->stream->nbStep > ret)
	    ret = comp->stream->nbStep;
	comp = comp->next;
    }
    return(ret);
}